

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

float mf_predict<sparse_parameters>(gdmf *d,example *ec,sparse_parameters *weights)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  pointer pbVar4;
  char *pcVar5;
  float *pfVar6;
  v_array<float> *this;
  example *ec_00;
  vw *pvVar7;
  uint uVar8;
  pointer pbVar9;
  const_iterator cVar10;
  byte *pbVar11;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var12;
  vw_exception *this_00;
  float **ppfVar13;
  byte *pbVar14;
  ulong *puVar15;
  float *pfVar16;
  size_t sVar17;
  features *pfVar18;
  gdmf *d_00;
  float res;
  float extraout_XMM0_Da;
  float fVar19;
  float linear_prediction;
  pred_offset x_dot_r;
  uint64_t index_1;
  pred_offset x_dot_l;
  stringstream __msg;
  float local_254;
  float local_244;
  features *local_240;
  byte *local_238;
  gdmf *local_230;
  undefined8 local_228;
  byte *local_220;
  ulong local_218;
  float local_210 [2];
  byte *local_208;
  v_array<float> *local_200;
  pointer local_1f8;
  example *local_1f0;
  vw *local_1e8;
  pointer local_1e0;
  string local_1d8;
  ulong local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  local_1e8 = d->all;
  pbVar9 = (local_1e8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (local_1e8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar4) {
    sVar17 = ec->num_features;
    do {
      pcVar5 = (pbVar9->_M_dataplus)._M_p;
      cVar1 = *pcVar5;
      cVar2 = pcVar5[1];
      sVar17 = sVar17 - ((long)(ec->super_example_predict).feature_space[cVar2].values._end -
                         (long)(ec->super_example_predict).feature_space[cVar2].values._begin >> 2)
                        * ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                           (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2
                          );
      ec->num_features = sVar17;
      cVar1 = *(pbVar9->_M_dataplus)._M_p;
      sVar17 = (ulong)d->rank *
               ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar17;
      ec->num_features = sVar17;
      cVar1 = (pbVar9->_M_dataplus)._M_p[1];
      sVar17 = (ulong)d->rank *
               ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar17;
      ec->num_features = sVar17;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  local_254 = (ec->l).simple.initial;
  local_200 = &d->scalars;
  local_230 = d;
  v_array<float>::clear(local_200);
  local_244 = 0.0;
  local_240 = (ec->super_example_predict).feature_space;
  pbVar11 = (ec->super_example_predict).indices._begin;
  local_238 = (ec->super_example_predict).indices._end;
  local_1f0 = ec;
  if (pbVar11 != local_238) {
    do {
      bVar3 = *pbVar11;
      pfVar16 = local_240[bVar3].values._begin;
      pfVar6 = local_240[bVar3].values._end;
      if (pfVar16 != pfVar6) {
        puVar15 = local_240[bVar3].indicies._begin;
        do {
          local_1b8 = *puVar15 & weights->_weight_mask;
          cVar10 = std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)weights,&local_1b8);
          ppfVar13 = (float **)
                     ((long)cVar10.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>
                            ._M_cur + 0x10);
          if (cVar10.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
              _M_cur == (__node_type *)0x0) {
            ppfVar13 = &weights->default_value;
          }
          local_244 = **ppfVar13 * *pfVar16 + local_244;
          pfVar16 = pfVar16 + 1;
          puVar15 = puVar15 + 1;
        } while (pfVar16 != pfVar6);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_238);
  }
  v_array<float>::push_back(local_200,&local_244);
  local_254 = local_254 + local_244;
  pbVar9 = (local_230->all->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (local_230->all->pairs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  d_00 = local_230;
  if (pbVar9 != local_1e0) {
    pfVar18 = local_240;
    do {
      pcVar5 = (pbVar9->_M_dataplus)._M_p;
      cVar1 = *pcVar5;
      if ((pfVar18[cVar1].values._end != pfVar18[cVar1].values._begin) &&
         (cVar1 = pcVar5[1], pbVar11 = (byte *)(ulong)d_00->rank,
         d_00->rank != 0 && pfVar18[cVar1].values._end != pfVar18[cVar1].values._begin)) {
        pbVar14 = (byte *)0x1;
        local_1f8 = pbVar9;
        do {
          uVar8 = (uint)pbVar11;
          local_210[0] = 0.0;
          cVar1 = *(local_1f8->_M_dataplus)._M_p;
          pfVar16 = pfVar18[cVar1].values._begin;
          pfVar6 = pfVar18[cVar1].values._end;
          local_238 = pbVar14;
          local_208 = pbVar14;
          if (pfVar16 != pfVar6) {
            puVar15 = pfVar18[cVar1].indicies._begin;
            do {
              fVar19 = *pfVar16;
              local_228 = *puVar15 & weights->_weight_mask;
              _Var12._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)weights,&local_228);
              if (_Var12._M_cur == (__node_type *)0x0) {
                local_1b0 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
                local_1b8 = local_228;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)weights,&local_1b8);
                _Var12._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_228);
                if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*weights->fun)(*(weight **)((long)_Var12._M_cur + 0x10),weights->default_data);
                }
              }
              local_210[0] = fVar19 * *(float *)(*(long *)((long)&((_Var12._M_cur)->
                                                                                                                                    
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                                  ._M_storage._M_storage + 8) + (long)local_208 * 4)
                             + local_210[0];
              pfVar16 = pfVar16 + 1;
              puVar15 = puVar15 + 1;
            } while (pfVar16 != pfVar6);
            uVar8 = local_230->rank;
            pfVar18 = local_240;
            d_00 = local_230;
          }
          fVar19 = 0.0;
          local_228 = (ulong)local_228._4_4_ << 0x20;
          local_220 = local_238 + uVar8;
          cVar1 = (local_1f8->_M_dataplus)._M_p[1];
          pfVar16 = pfVar18[cVar1].values._begin;
          pfVar6 = pfVar18[cVar1].values._end;
          if (pfVar16 != pfVar6) {
            puVar15 = local_240[cVar1].indicies._begin;
            do {
              fVar19 = *pfVar16;
              local_218 = *puVar15 & weights->_weight_mask;
              _Var12._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)weights,&local_218);
              if (_Var12._M_cur == (__node_type *)0x0) {
                local_1b0 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
                local_1b8 = local_218;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)weights,&local_1b8);
                _Var12._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_218);
                if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*weights->fun)(*(weight **)((long)_Var12._M_cur + 0x10),weights->default_data);
                }
              }
              fVar19 = fVar19 * *(float *)(*(long *)((long)&((_Var12._M_cur)->
                                                                                                                        
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                                  ._M_storage._M_storage + 8) + (long)local_220 * 4)
                       + (float)local_228;
              local_228 = CONCAT44(local_228._4_4_,fVar19);
              pfVar16 = pfVar16 + 1;
              puVar15 = puVar15 + 1;
              d_00 = local_230;
            } while (pfVar16 != pfVar6);
          }
          this = local_200;
          local_254 = local_254 + fVar19 * local_210[0];
          v_array<float>::push_back(local_200,local_210);
          v_array<float>::push_back(this,(float *)&local_228);
          pbVar14 = local_238 + 1;
          pbVar11 = (byte *)(ulong)d_00->rank;
          pfVar18 = local_240;
          pbVar9 = local_1f8;
        } while (local_238 < pbVar11);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_1e0);
  }
  pvVar7 = local_1e8;
  ec_00 = local_1f0;
  if ((local_1e8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_1e8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"cannot use triples in matrix factorization",0x2a);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
               ,0x96,&local_1d8);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_1f0->partial_prediction = local_254;
  (*local_1e8->set_minmax)(local_1e8->sd,(local_1f0->l).simple.label);
  res = GD::finalize_prediction(pvVar7->sd,ec_00->partial_prediction);
  (ec_00->pred).scalar = res;
  fVar19 = (ec_00->l).simple.label;
  if ((fVar19 != 3.4028235e+38) || (NAN(fVar19))) {
    (*pvVar7->loss->_vptr_loss_function[1])(pvVar7->loss,pvVar7->sd);
    ec_00->loss = extraout_XMM0_Da * ec_00->weight;
    res = (ec_00->pred).scalar;
  }
  if (pvVar7->audit == true) {
    print_result(d_00->all->stdout_fileno,res,-1.0,ec_00->tag);
    mf_print_offset_features(d_00,ec_00,0);
    res = (ec_00->pred).scalar;
  }
  return res;
}

Assistant:

float mf_predict(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;
  float prediction = ld.initial;

  for (string& i : d.all->pairs)
  {
    ec.num_features -= ec.feature_space[(int)i[0]].size() * ec.feature_space[(int)i[1]].size();
    ec.num_features += ec.feature_space[(int)i[0]].size() * d.rank;
    ec.num_features += ec.feature_space[(int)i[1]].size() * d.rank;
  }

  // clear stored predictions
  d.scalars.clear();

  float linear_prediction = 0.;
  // linear terms

  for (features& fs : ec) GD::foreach_feature<float, GD::vec_add, T>(weights, fs, linear_prediction);

  // store constant + linear prediction
  // note: constant is now automatically added
  d.scalars.push_back(linear_prediction);

  prediction += linear_prediction;
  // interaction terms
  for (string& i : d.all->pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      for (uint64_t k = 1; k <= d.rank; k++)
      {
        // x_l * l^k
        // l^k is from index+1 to index+d.rank
        // float x_dot_l = sd_offset_add(weights, ec.atomics[(int)(*i)[0]].begin(), ec.atomics[(int)(*i)[0]].end(), k);
        pred_offset x_dot_l = {0., k};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[0]], x_dot_l);
        // x_r * r^k
        // r^k is from index+d.rank+1 to index+2*d.rank
        // float x_dot_r = sd_offset_add(weights, ec.atomics[(int)(*i)[1]].begin(), ec.atomics[(int)(*i)[1]].end(),
        // k+d.rank);
        pred_offset x_dot_r = {0., k + d.rank};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[1]], x_dot_r);

        prediction += x_dot_l.p * x_dot_r.p;

        // store prediction from interaction terms
        d.scalars.push_back(x_dot_l.p);
        d.scalars.push_back(x_dot_r.p);
      }
    }
  }

  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");

  // d.scalars has linear, x_dot_l_1, x_dot_r_1, x_dot_l_2, x_dot_r_2, ...

  ec.partial_prediction = prediction;

  all.set_minmax(all.sd, ld.label);

  ec.pred.scalar = GD::finalize_prediction(all.sd, ec.partial_prediction);

  if (ld.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;

  if (all.audit)
    mf_print_audit_features(d, ec, 0);

  return ec.pred.scalar;
}